

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall
xray_re::cse_alife_trader_abstract::state_read
          (cse_alife_trader_abstract *this,xr_packet *packet,uint16_t size)

{
  ushort uVar1;
  uint8_t uVar2;
  int iVar3;
  uint32_t uVar4;
  undefined4 extraout_var;
  uint16_t *puVar5;
  size_t n;
  uint16_t version;
  uint16_t size_local;
  xr_packet *packet_local;
  cse_alife_trader_abstract *this_local;
  
  iVar3 = (*this->_vptr_cse_alife_trader_abstract[5])();
  puVar5 = cse_abstract::version((cse_abstract *)CONCAT44(extraout_var,iVar3));
  uVar1 = *puVar5;
  if (0x13 < uVar1) {
    if ((uVar1 < 0x6c) && (uVar4 = xr_packet::r_u32(packet), uVar4 != 0)) {
      __assert_fail("n == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity.cxx"
                    ,0x526,
                    "virtual void xray_re::cse_alife_trader_abstract::state_read(xr_packet &, uint16_t)"
                   );
    }
    if (uVar1 < 0x24) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity.cxx"
                    ,0x529,
                    "virtual void xray_re::cse_alife_trader_abstract::state_read(xr_packet &, uint16_t)"
                   );
    }
    if (0x3e < uVar1) {
      xr_packet::r_u32(packet,&this->m_money);
    }
    if ((0x4b < uVar1) && (uVar1 < 0x62)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity.cxx"
                    ,0x52d,
                    "virtual void xray_re::cse_alife_trader_abstract::state_read(xr_packet &, uint16_t)"
                   );
    }
    if (0x2e < uVar1) {
      xr_packet::r_sz(packet,&this->m_specific_character);
    }
    if (0x4d < uVar1) {
      xr_packet::r_u32(packet,&this->m_trader_flags);
    }
    if ((0x51 < uVar1) && (uVar1 < 0x60)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity.cxx"
                    ,0x533,
                    "virtual void xray_re::cse_alife_trader_abstract::state_read(xr_packet &, uint16_t)"
                   );
    }
    if (0x5f < uVar1) {
      xr_packet::r_sz(packet,&this->m_character_profile);
    }
    if (0x55 < uVar1) {
      xr_packet::r_s32(packet,&this->m_community_index);
    }
    if (0x56 < uVar1) {
      xr_packet::r_s32(packet,&this->m_rank);
      xr_packet::r_s32(packet,&this->m_reputation);
    }
    if (0x68 < uVar1) {
      xr_packet::r_sz(packet,&this->m_character_name);
    }
    if (0x7f < uVar1) {
      uVar2 = xr_packet::r_u8(packet);
      this->m_unk1_u8 = uVar2;
      uVar2 = xr_packet::r_u8(packet);
      this->m_unk2_u8 = uVar2;
    }
  }
  return;
}

Assistant:

void cse_alife_trader_abstract::state_read(xr_packet& packet, uint16_t size)
{
	uint16_t version = base()->version();
	if (version > CSE_VERSION_0x13) {
		if (version < CSE_VERSION_0x6c) {
			size_t n = packet.r_u32();
			xr_assert(n == 0);
		}
		if (version < CSE_VERSION_0x24)
			xr_not_implemented();
		if (version > CSE_VERSION_0x3e)
			packet.r_u32(m_money);
		if (version > CSE_VERSION_0x4b && version < CSE_VERSION_0x62)
			xr_not_implemented();
		if (version > CSE_VERSION_0x2e)
			packet.r_sz(m_specific_character);
		if (version > CSE_VERSION_0x4d)
			packet.r_u32(m_trader_flags);
		if (version > CSE_VERSION_0x51 && version < CSE_VERSION_0x60)
			xr_not_implemented();
		if (version > CSE_VERSION_0x5f)
			packet.r_sz(m_character_profile);
		if (version > CSE_VERSION_0x55)
			packet.r_s32(m_community_index);
		if (version > CSE_VERSION_0x56) {
			packet.r_s32(m_rank);
			packet.r_s32(m_reputation);
		}
		if (version > CSE_VERSION_0x68)
			packet.r_sz(m_character_name);

		if (version >= CSE_VERSION_0x80)
		{
			m_unk1_u8 = packet.r_u8();
			m_unk2_u8 = packet.r_u8();
		}
	}
}